

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall
DnsStats::RegisterStatsByIp(DnsStats *this,uint8_t *dest_addr,size_t dest_addr_length)

{
  uint32_t uVar1;
  bool local_8d [8];
  bool stored;
  StatsByIP *local_80;
  StatsByIP *y;
  StatsByIP x;
  size_t dest_addr_length_local;
  uint8_t *dest_addr_local;
  DnsStats *this_local;
  
  x.option_mask = dest_addr_length;
  StatsByIP::StatsByIP
            ((StatsByIP *)&y,dest_addr,dest_addr_length,(bool)(this->is_do_flag_set & 1),
             (bool)(this->is_using_edns & 1),(bool)(~this->is_qname_minimized & 1),
             (bool)(this->is_recursive_query & 1));
  local_80 = BinHash<StatsByIP>::Retrieve(&this->statsByIp,(StatsByIP *)&y);
  x.nb_tcp_443._1_1_ = 1;
  if (local_80 == (StatsByIP *)0x0) {
    uVar1 = BinHash<StatsByIP>::GetCount(&this->statsByIp);
    if (uVar1 < this->max_stats_by_ip_count) {
      local_8d[0] = false;
      BinHash<StatsByIP>::InsertOrAdd(&this->statsByIp,(StatsByIP *)&y,true,local_8d);
    }
  }
  else {
    (*local_80->_vptr_StatsByIP[3])(local_80,&y);
  }
  StatsByIP::~StatsByIP((StatsByIP *)&y);
  return;
}

Assistant:

void DnsStats::RegisterStatsByIp(uint8_t * dest_addr, size_t dest_addr_length)
{
    StatsByIP x(dest_addr, dest_addr_length, is_do_flag_set, is_using_edns,
        !is_qname_minimized, is_recursive_query);
    StatsByIP * y = statsByIp.Retrieve(&x);

    x.response_seen = true;

    if (y == NULL) {
        if (statsByIp.GetCount() < max_stats_by_ip_count) {
            bool stored = false;

            (void)statsByIp.InsertOrAdd(&x, true, &stored);
        }
    }
    else {
        y->Add(&x);
    }
}